

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void gai_print_subscript(char *pre,int ndim,Integer *subscript,char *post)

{
  uint uVar1;
  ulong uVar2;
  
  printf("%s [",pre);
  uVar1 = ndim;
  if (ndim < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    printf("%ld",subscript[uVar2]);
    if (ndim - 1 == uVar2) {
      printf("] %s",post);
    }
    else {
      putchar(0x2c);
    }
  }
  return;
}

Assistant:

void gai_print_subscript(char *pre,int ndim, Integer subscript[], char* post)
{
        int i;

        printf("%s [",pre);
        for(i=0;i<ndim;i++){
                printf("%ld",(long)subscript[i]);
                if(i==ndim-1)printf("] %s",post);
                else printf(",");
        }
}